

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_(TimeInMillis ms)

{
  bool bVar1;
  string *in_RDI;
  tm time_struct;
  tm *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  string *__lhs;
  string local_248 [16];
  int *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [36];
  int local_1a4;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [12];
  int in_stack_ffffffffffffff6c;
  string local_80 [55];
  allocator<char> local_49 [21];
  int local_34;
  
  __lhs = in_RDI;
  bVar1 = PortableLocaltime((time_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  if (bVar1) {
    local_1a4 = local_34 + 0x76c;
    StreamableToString<int>(in_stack_fffffffffffffdc8);
    std::operator+(__lhs,in_stack_fffffffffffffda0);
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff6c);
    std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::operator+(__lhs,in_stack_fffffffffffffda0);
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff6c);
    std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::operator+(__lhs,in_stack_fffffffffffffda0);
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff6c);
    std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::operator+(__lhs,in_stack_fffffffffffffda0);
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff6c);
    std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::operator+(__lhs,in_stack_fffffffffffffda0);
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff6c);
    std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_1a0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,
               (allocator<char> *)in_stack_fffffffffffffdd0);
    std::allocator<char>::~allocator(local_49);
  }
  return in_RDI;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}